

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O3

int run_test_random_async(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  long lVar5;
  char *extraout_RDX;
  uv_random_t req;
  undefined1 auStack_3b8 [256];
  undefined1 auStack_2b8 [256];
  code *pcStack_1b8;
  undefined1 auStack_1b0 [256];
  uv_loop_t *puStack_b0;
  uv_random_t uStack_98;
  
  iVar2 = (int)&uStack_98;
  puVar3 = uv_default_loop();
  lVar5 = 0x100;
  iVar1 = uv_random(puVar3,&uStack_98,scratch,0x100,0xffffffff,random_cb);
  if (iVar1 == -0x16) {
    lVar5 = -1;
    iVar2 = (int)&uStack_98;
    iVar1 = uv_random(puVar3,&uStack_98,scratch,0xffffffffffffffff,0xffffffff,random_cb);
    if (iVar1 != -7) goto LAB_00166447;
    lVar5 = 0;
    iVar2 = (int)&uStack_98;
    iVar1 = uv_random(puVar3,&uStack_98,scratch,0,0,random_cb);
    if (iVar1 != 0) goto LAB_0016644c;
    if (random_cb_called != 0) goto LAB_00166451;
    iVar2 = 0;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00166456;
    if (random_cb_called != 1) goto LAB_0016645b;
    lVar5 = 0x100;
    iVar2 = (int)&uStack_98;
    iVar1 = uv_random(puVar3,&uStack_98,scratch,0x100,0,random_cb);
    if (iVar1 != 0) goto LAB_00166460;
    if (random_cb_called != 1) goto LAB_00166465;
    iVar2 = 0;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016646a;
    if (random_cb_called != 2) goto LAB_0016646f;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_random_async_cold_1();
LAB_00166447:
    run_test_random_async_cold_2();
LAB_0016644c:
    run_test_random_async_cold_3();
LAB_00166451:
    run_test_random_async_cold_4();
LAB_00166456:
    run_test_random_async_cold_5();
LAB_0016645b:
    run_test_random_async_cold_6();
LAB_00166460:
    run_test_random_async_cold_7();
LAB_00166465:
    run_test_random_async_cold_8();
LAB_0016646a:
    run_test_random_async_cold_9();
LAB_0016646f:
    run_test_random_async_cold_10();
  }
  run_test_random_async_cold_11();
  pcStack_1b8 = (code *)0x16649b;
  puStack_b0 = puVar3;
  memset(auStack_1b0,0,0x100);
  iVar1 = random_cb_called;
  if (iVar2 == 0) {
    if (extraout_RDX != scratch) goto LAB_00166511;
    if (random_cb_called != 0) {
      if (lVar5 == 0x100) {
        pcStack_1b8 = (code *)0x1664d2;
        iVar2 = bcmp(scratch,auStack_1b0,0x100);
        if (iVar2 != 0) goto LAB_001664f8;
        pcStack_1b8 = (code *)0x1664db;
        random_cb_cold_4();
        goto LAB_001664db;
      }
      goto LAB_00166516;
    }
LAB_001664db:
    if (lVar5 != 0) goto LAB_0016651b;
    pcStack_1b8 = (code *)0x1664f4;
    iVar2 = bcmp(scratch,auStack_1b0,0x100);
    if (iVar2 == 0) {
LAB_001664f8:
      random_cb_called = iVar1 + 1;
      return iVar2;
    }
  }
  else {
    pcStack_1b8 = (code *)0x166511;
    random_cb_cold_1();
LAB_00166511:
    pcStack_1b8 = (code *)0x166516;
    random_cb_cold_2();
LAB_00166516:
    pcStack_1b8 = (code *)0x16651b;
    random_cb_cold_3();
LAB_0016651b:
    pcStack_1b8 = (code *)0x166520;
    random_cb_cold_5();
  }
  pcStack_1b8 = run_test_random_sync;
  random_cb_cold_6();
  puVar4 = (uv_loop_t *)auStack_3b8;
  puVar3 = (uv_loop_t *)0x0;
  pcStack_1b8 = (code *)lVar5;
  iVar2 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_3b8,0x100,0xffffffff,
                    (uv_random_cb)0x0);
  if (iVar2 == -0x16) {
    puVar3 = (uv_loop_t *)0x0;
    iVar2 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_3b8,0xffffffffffffffff,0xffffffff,
                      (uv_random_cb)0x0);
    if (iVar2 != -7) goto LAB_00166611;
    memset(auStack_3b8,0,0x100);
    puVar3 = (uv_loop_t *)0x0;
    iVar2 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_3b8,0x100,0,(uv_random_cb)0x0);
    if (iVar2 != 0) goto LAB_00166616;
    memset(auStack_2b8,0,0x100);
    iVar2 = bcmp(auStack_3b8,auStack_2b8,0x100);
    if (iVar2 != 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00166620;
    }
  }
  else {
    run_test_random_sync_cold_1();
LAB_00166611:
    run_test_random_sync_cold_2();
LAB_00166616:
    puVar4 = puVar3;
    run_test_random_sync_cold_3();
  }
  run_test_random_sync_cold_5();
LAB_00166620:
  run_test_random_sync_cold_4();
  iVar2 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(random_async) {
  uv_random_t req;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT(UV_EINVAL == uv_random(loop, &req, scratch, sizeof(scratch), -1,
                                random_cb));
  ASSERT(UV_E2BIG == uv_random(loop, &req, scratch, -1, -1, random_cb));

  ASSERT(0 == uv_random(loop, &req, scratch, 0, 0, random_cb));
  ASSERT(0 == random_cb_called);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == random_cb_called);

  ASSERT(0 == uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb));
  ASSERT(1 == random_cb_called);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(2 == random_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}